

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void handleNewWalletRequest(char *initiatorPubKey,json *package)

{
  value_t vVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *__s1;
  undefined8 *puVar7;
  char *__s;
  json *this;
  int iVar8;
  reference pvVar9;
  size_t sVar10;
  reference wallet_definition_template;
  long lVar11;
  char *pcVar12;
  size_type idx;
  size_t sVar13;
  bool bVar14;
  bool ret;
  string_t local_80;
  size_t local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  json *local_40;
  ulong local_38;
  
  pvVar9 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)package,"body");
  pvVar9 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar9,"wallet");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(&local_80,pvVar9,-1,' ',false,strict);
  pcVar12 = (char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar12 != &local_80.field_2) {
    operator_delete(pcVar12,local_80.field_2._M_allocated_capacity + 1);
  }
  if (pcVar12 == (char *)0x0) {
    pcVar12 = "Wallet must be a char";
    lVar11 = 0x15;
    goto LAB_001f3170;
  }
  if ((_TLS_server_method ==
       "N8nlohmann10basic_jsonISt3mapSt6vectorNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEblmdSaNS_14adl_serializerEEE"
      ) || (iVar8 = strcmp("N8nlohmann10basic_jsonISt3mapSt6vectorNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEblmdSaNS_14adl_serializerEEE"
                           ,_TLS_server_method), iVar8 == 0)) {
    pvVar9 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)package,"body");
    pvVar9 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar9,"is_single_address");
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (pvVar9,(boolean_t *)&local_80);
    if ((char)local_80._M_dataplus._M_p == '\x01') {
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)package,"body");
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar9,"other_cosigners");
      vVar1 = pvVar9->m_type;
      sVar13 = (size_t)vVar1;
      if (vVar1 != null) {
        if (vVar1 == object) {
          sVar13 = (((pvVar9->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        }
        else if (vVar1 == array) {
          sVar13 = (long)(((pvVar9->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(((pvVar9->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4;
        }
        else {
          sVar13 = 1;
        }
      }
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)package,"body");
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar9,"other_cosigners");
      vVar1 = pvVar9->m_type;
      if (vVar1 == null) {
LAB_001f2d76:
        pcVar12 = "other_cosigners cannot be empty";
        lVar11 = 0x1f;
      }
      else {
        if (vVar1 == object) {
          bVar14 = (((pvVar9->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
                   0;
LAB_001f2d6f:
          if (bVar14) goto LAB_001f2d76;
        }
        else if (vVar1 == array) {
          bVar14 = (((pvVar9->m_value).array)->
                   super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   )._M_impl.super__Vector_impl_data._M_start ==
                   (((pvVar9->m_value).array)->
                   super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_001f2d6f;
        }
        local_60 = sVar13;
        local_50 = initiatorPubKey;
        pvVar9 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)package,"device_hub");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump(&local_80,pvVar9,-1,' ',false,strict);
        local_58 = (char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58 != &local_80.field_2) {
          operator_delete(local_58,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((local_58 != (char *)0x0) && (sVar10 = strlen(local_58), sVar10 < 0x1e)) {
          newWallet.isCreating = true;
          strcpy(newWallet.initiatorHub,local_58);
          newWallet.initiatorPubKey._0_8_ = *(undefined8 *)local_50;
          newWallet.initiatorPubKey._8_8_ = *(undefined8 *)(local_50 + 8);
          newWallet.initiatorPubKey._16_8_ = *(undefined8 *)(local_50 + 0x10);
          newWallet.initiatorPubKey._37_8_ = *(undefined8 *)(local_50 + 0x25);
          newWallet.initiatorPubKey._24_5_ = SUB85(*(undefined8 *)(local_50 + 0x18),0);
          newWallet.initiatorPubKey._29_3_ = SUB83(*(undefined8 *)(local_50 + 0x1d),0);
          newWallet.initiatorPubKey._32_5_ =
               SUB85((ulong)*(undefined8 *)(local_50 + 0x1d) >> 0x18,0);
          newWallet.id._0_8_ = *(undefined8 *)pcVar12;
          newWallet.id._8_8_ = *(undefined8 *)(pcVar12 + 8);
          newWallet.id._16_8_ = *(undefined8 *)(pcVar12 + 0x10);
          newWallet.id._37_8_ = *(undefined8 *)(pcVar12 + 0x25);
          newWallet.id._24_5_ = SUB85(*(undefined8 *)(pcVar12 + 0x18),0);
          newWallet.id._29_3_ = SUB83(*(undefined8 *)(pcVar12 + 0x1d),0);
          newWallet.id._32_5_ = SUB85((ulong)*(undefined8 *)(pcVar12 + 0x1d) >> 0x18,0);
          if (0 < (int)(uint)local_60) {
            pcVar12 = newWallet.xPubKeyQueue[0].recipientHub;
            local_38 = (ulong)((uint)local_60 & 0x7fffffff);
            idx = 0;
            local_48 = byteduino_device.deviceAddress;
            local_40 = package;
            do {
              this = local_40;
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_40,"body");
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar9,"other_cosigners");
              pvVar9 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::operator[](pvVar9,idx);
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar9,"device_address");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::dump(&local_80,pvVar9,-1,' ',false,strict);
              __s1 = (char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                      (char)local_80._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__s1 != &local_80.field_2) {
                operator_delete(__s1,local_80.field_2._M_allocated_capacity + 1);
              }
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)this,"body");
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar9,"other_cosigners");
              pvVar9 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::operator[](pvVar9,idx);
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar9,"pubkey");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::dump(&local_80,pvVar9,-1,' ',false,strict);
              puVar7 = (undefined8 *)
                       CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar7 != &local_80.field_2) {
                operator_delete(puVar7,local_80.field_2._M_allocated_capacity + 1);
              }
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)this,"body");
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar9,"other_cosigners");
              pvVar9 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::operator[](pvVar9,idx);
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar9,"device_hub");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::dump(&local_80,pvVar9,-1,' ',false,strict);
              __s = (char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p
                                    );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__s != &local_80.field_2) {
                operator_delete(__s,local_80.field_2._M_allocated_capacity + 1);
              }
              if (((__s != (char *)0x0 && (__s1 != (char *)0x0 && puVar7 != (undefined8 *)0x0)) &&
                  (sVar10 = strlen(__s), sVar10 < 0x1e)) &&
                 (iVar8 = strcmp(__s1,local_48), iVar8 != 0)) {
                ((queueXpubkeyTobeSent *)(pcVar12 + -0x2e))->isFree = false;
                uVar2 = puVar7[1];
                uVar3 = puVar7[2];
                uVar4 = puVar7[3];
                uVar5 = *(undefined8 *)((long)puVar7 + 0x1d);
                uVar6 = *(undefined8 *)((long)puVar7 + 0x25);
                *(undefined8 *)(pcVar12 + -0x2d) = *puVar7;
                *(undefined8 *)(pcVar12 + -0x25) = uVar2;
                *(undefined8 *)(pcVar12 + -0x1d) = uVar3;
                *(undefined8 *)(pcVar12 + -0x15) = uVar4;
                *(undefined8 *)(pcVar12 + -0x10) = uVar5;
                *(undefined8 *)(pcVar12 + -8) = uVar6;
                strcpy(pcVar12,__s);
              }
              idx = idx + 1;
              pcVar12 = pcVar12 + 0x4c;
              package = local_40;
            } while (local_38 != idx);
          }
        }
        iVar8 = (int)local_60 + 1;
        newWallet.xPubKeyQueue[iVar8].isFree = false;
        uVar2 = *(undefined8 *)(local_50 + 8);
        uVar3 = *(undefined8 *)(local_50 + 0x10);
        uVar4 = *(undefined8 *)(local_50 + 0x18);
        uVar5 = *(undefined8 *)(local_50 + 0x1d);
        uVar6 = *(undefined8 *)(local_50 + 0x25);
        *(undefined8 *)newWallet.xPubKeyQueue[iVar8].recipientPubKey = *(undefined8 *)local_50;
        *(undefined8 *)(newWallet.xPubKeyQueue[iVar8].recipientPubKey + 8) = uVar2;
        *(undefined8 *)(newWallet.xPubKeyQueue[iVar8].recipientPubKey + 0x10) = uVar3;
        *(undefined8 *)(newWallet.xPubKeyQueue[iVar8].recipientPubKey + 0x18) = uVar4;
        *(undefined8 *)(newWallet.xPubKeyQueue[iVar8].recipientPubKey + 0x1d) = uVar5;
        *(undefined8 *)(newWallet.xPubKeyQueue[iVar8].recipientPubKey + 0x25) = uVar6;
        strcpy(newWallet.xPubKeyQueue[iVar8].recipientHub,local_58);
        pvVar9 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)package,"body");
        pvVar9 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pvVar9,"wallet_name");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump(&local_80,pvVar9,-1,' ',false,strict);
        pcVar12 = (char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar12 != &local_80.field_2) {
          operator_delete(pcVar12,local_80.field_2._M_allocated_capacity + 1);
        }
        if (pcVar12 != (char *)0x0) {
          pvVar9 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)package,"body");
          wallet_definition_template =
               nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar9,"wallet_definition_template");
          saveWalletDefinitionInFlash((char *)pvVar9,pcVar12,wallet_definition_template);
          return;
        }
        pcVar12 = "wallet_definition_template and wallet_name must be char";
        lVar11 = 0x37;
      }
      goto LAB_001f3170;
    }
  }
  pcVar12 = "Wallet must single address wallet";
  lVar11 = 0x21;
LAB_001f3170:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,pcVar12,lVar11);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return;
}

Assistant:

void handleNewWalletRequest(char initiatorPubKey [45], nlohmann::json& package){
	const char* wallet = package["body"]["wallet"].dump().c_str();
	if (wallet != nullptr){
		if (typeid(package["body"]["is_single_address"]) == typeid(bool) && package["body"]["is_single_address"]){
			if(typeid(package["body"]["other_cosigners"]) == typeid(nlohmann::json)){
				int otherCosignersSize = package["body"]["other_cosigners"].size();
				if (!package["body"]["other_cosigners"].empty()){
					const char * initiator_device_hub = package["device_hub"].dump().c_str();
					if (initiator_device_hub != nullptr && strlen(initiator_device_hub) < MAX_HUB_STRING_SIZE){
						newWallet.isCreating = true;
						strcpy(newWallet.initiatorHub, initiator_device_hub);
						memcpy(newWallet.initiatorPubKey,initiatorPubKey,45);
						memcpy(newWallet.id,wallet,45);


						for (int i = 0; i < otherCosignersSize;i++){
							const  char* device_address = package["body"]["other_cosigners"][i]["device_address"].dump().c_str();
							const  char* pubkey = package["body"]["other_cosigners"][i]["pubkey"].dump().c_str();
							const  char* device_hub = package["body"]["other_cosigners"][i]["device_hub"].dump().c_str();

							if (pubkey != nullptr && device_address != nullptr && device_hub != nullptr){
								if (strlen(device_hub) < MAX_HUB_STRING_SIZE){
									if (strcmp(device_address, byteduino_device.deviceAddress) != 0){
										newWallet.xPubKeyQueue[i].isFree = false;
										memcpy(newWallet.xPubKeyQueue[i].recipientPubKey, pubkey,45);
										strcpy(newWallet.xPubKeyQueue[i].recipientHub, device_hub);
									}
								}

							}
						}
					}
					newWallet.xPubKeyQueue[otherCosignersSize+1].isFree = false;
					memcpy(newWallet.xPubKeyQueue[otherCosignersSize+1].recipientPubKey, initiatorPubKey, 45);
					strcpy(newWallet.xPubKeyQueue[otherCosignersSize+1].recipientHub, initiator_device_hub);

					const char* wallet_name = package["body"]["wallet_name"].dump().c_str();
					if (wallet_name != nullptr &&
                            typeid(package["body"]["wallet_definition_template"]) == typeid(nlohmann::json)){
						saveWalletDefinitionInFlash(wallet, wallet_name, package["body"]["wallet_definition_template"]);
					} else {
#ifdef DEBUG_PRINT
						std::clog << "wallet_definition_template and wallet_name must be char" << std::endl;
#endif
					}
				} else {
#ifdef DEBUG_PRINT
					std::clog << "other_cosigners cannot be empty" << std::endl;
#endif
				}
			} else {
#ifdef DEBUG_PRINT
				std::clog << "other_cosigners must be an array" << std::endl;
#endif
			}
		} else {
			std::clog << "Wallet must single address wallet" << std::endl;
		}
	} else {
#ifdef DEBUG_PRINT
		std::clog << "Wallet must be a char" << std::endl;
#endif
	}

}